

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O2

void __thiscall
EventPlayer::EventPlayer
          (EventPlayer *this,Time *time,string *filename,double resolution,EventFileType fileType)

{
  long *plVar1;
  allocator<char> local_271;
  double local_270;
  double local_268;
  unsigned_long a;
  fstream stream;
  byte abStack_220 [496];
  
  local_268 = resolution;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,"",(allocator<char> *)&local_270);
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"Event Generator",&local_271);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,(string *)&stream,(string *)&a);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&stream);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_00154f10;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_00154fa8;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_00154ff0;
  (this->playerFileName)._M_dataplus._M_p = (pointer)&(this->playerFileName).field_2;
  (this->playerFileName)._M_string_length = 0;
  (this->playerFileName).field_2._M_local_buf[0] = '\0';
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (fileType == ASCII) {
    std::fstream::fstream(&stream,(filename->_M_dataplus)._M_p,_S_in);
    while ((abStack_220[*(long *)(_stream + -0x18)] & 2) == 0) {
      std::istream::_M_extract<double>((double *)&stream);
      local_270 = (double)a * local_268;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&this->playerBuffer,&local_270);
    }
  }
  else {
    if (fileType != BINARY8LE) {
      return;
    }
    std::fstream::fstream(&stream,(filename->_M_dataplus)._M_p,_S_in|_S_bin);
    while (plVar1 = (long *)std::istream::read((char *)&stream,(long)&a),
          (*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) == 0) {
      local_270 = (((double)CONCAT44(0x45300000,(int)(a >> 0x20)) - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)a) - 4503599627370496.0)) * local_268;
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&this->playerBuffer,&local_270);
    }
  }
  std::fstream::~fstream(&stream);
  return;
}

Assistant:

EventPlayer::EventPlayer( Time *time, string filename, double resolution, EventFileType fileType)
	: StochasticEventGenerator(time)
{
	if (fileType==BINARY8LE) {
		
		// open file
		fstream stream( filename.c_str(), ios::in | ios::binary);
		
		// read file contents into buffer
		unsigned long int a;
		bool success = true;
		while (success) {
			success = (bool) stream.read((char *)&a, 8);
			if (success)
				playerBuffer.push_back(double(a) * resolution);
		}
	}
	else if (fileType==ASCII) {

		// open file
		fstream stream( filename.c_str(), ios::in );
		
		// read file contents into buffer
		double a;
		while (!stream.eof()) {
			stream >> a;
			playerBuffer.push_back(a * resolution);
		}
	}
}